

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmXMLParser.cxx
# Opt level: O1

int __thiscall cmXMLParser::InitializeParser(cmXMLParser *this)

{
  XML_Parser parser;
  bool bVar1;
  
  bVar1 = this->Parser == (void *)0x0;
  if (bVar1) {
    parser = XML_ParserCreate((XML_Char *)0x0);
    this->Parser = parser;
    XML_SetElementHandler(parser,cmXMLParserStartElement,cmXMLParserEndElement);
    XML_SetCharacterDataHandler((XML_Parser)this->Parser,cmXMLParserCharacterDataHandler);
    XML_SetUserData((XML_Parser)this->Parser,this);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Parser already initialized",0x1a);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
  }
  this->ParseError = (uint)!bVar1;
  return (uint)bVar1;
}

Assistant:

int cmXMLParser::InitializeParser()
{
  if (this->Parser) {
    std::cerr << "Parser already initialized" << std::endl;
    this->ParseError = 1;
    return 0;
  }

  // Create the expat XML parser.
  this->Parser = XML_ParserCreate(nullptr);
  XML_SetElementHandler(static_cast<XML_Parser>(this->Parser),
                        &cmXMLParserStartElement, &cmXMLParserEndElement);
  XML_SetCharacterDataHandler(static_cast<XML_Parser>(this->Parser),
                              &cmXMLParserCharacterDataHandler);
  XML_SetUserData(static_cast<XML_Parser>(this->Parser), this);
  this->ParseError = 0;
  return 1;
}